

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_attack(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  random_conflict rVar4;
  
  pvVar3 = parser_priv(p);
  rVar4 = parser_getrand(p,"hd");
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    *(char *)((long)pvVar3 + 0x30) = (char)rVar4.dice;
    *(char *)((long)pvVar3 + 0x31) = (char)rVar4.sides;
    wVar1 = parser_getint(p,"to-h");
    *(short *)((long)pvVar3 + 0x28) = (short)wVar1;
    wVar1 = parser_getint(p,"to-d");
    *(short *)((long)pvVar3 + 0x2a) = (short)wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_artifact_attack(struct parser *p) {
	struct artifact *a = parser_priv(p);
	struct random hd = parser_getrand(p, "hd");

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	a->dd = hd.dice;
	a->ds = hd.sides;
	a->to_h = parser_getint(p, "to-h");
	a->to_d = parser_getint(p, "to-d");
	return PARSE_ERROR_NONE;
}